

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int set_array_length(JSContext *ctx,JSObject *p,JSValue val,int flags)

{
  uint uVar1;
  JSVarRef **ppJVar2;
  JSProperty *pJVar3;
  JSValue *pJVar4;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  JSAtom JVar8;
  double dVar9;
  JSShape *pJVar10;
  int64_t iVar11;
  JSShape *pJVar12;
  JSValueUnion JVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  double dVar18;
  JSShape *pJVar19;
  JSValueUnion JVar20;
  JSValue v;
  JSValue JVar21;
  uint32_t idx;
  uint32_t len;
  uint local_5c;
  uint local_58;
  uint local_54;
  JSValueUnion local_50;
  uint local_44;
  JSShape *local_40;
  uint local_34;
  
  iVar5 = JS_ToArrayLengthFree(ctx,&local_34,val,0);
  iVar6 = -1;
  if (iVar5 == 0) {
    if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
      iVar5 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
      return iVar5;
    }
    if (((p->field_0).header.dummy1 & 8) == 0) {
      pJVar4 = (JSValue *)p->prop;
      local_50 = pJVar4->u;
      JVar21 = *pJVar4;
      if (0xfffffff4 < (uint)pJVar4->tag) {
        *(int *)local_50.ptr = *local_50.ptr + 1;
      }
      JS_ToInt32Free(ctx,(int32_t *)&local_5c,JVar21);
      local_58 = local_34;
      if (local_34 < local_5c) {
        pJVar10 = p->shape;
        uVar1 = pJVar10->prop_count;
        pJVar12 = (JSShape *)(ulong)uVar1;
        uVar16 = local_5c;
        if (uVar1 < local_5c - local_34) {
          local_5c = local_34;
          local_40 = pJVar12;
          if (0 < (int)uVar1) {
            pJVar19 = pJVar10 + 1;
            local_44 = local_34;
            lVar15 = 0;
            local_54 = local_34;
            do {
              JVar8 = *(JSAtom *)(&pJVar10[1].header.field_0x4 + lVar15 * 8);
              if ((((JVar8 != 0) &&
                   (BVar7 = JS_AtomIsArrayIndex(ctx,(uint32_t *)&local_50.int32,JVar8),
                   pJVar12 = local_40, BVar7 != 0)) && (local_54 <= (uint)local_50.int32)) &&
                 ((*(byte *)((long)&pJVar10[1].header.ref_count + lVar15 * 8 + 3) & 4) == 0)) {
                local_54 = local_50.int32 + 1U;
                local_44 = local_50.int32 + 1U;
              }
              lVar15 = lVar15 + 1;
            } while ((int)pJVar12 != (int)lVar15);
            local_5c = local_44;
            if (0 < (int)pJVar12) {
              lVar17 = 0x40;
              local_54 = local_44;
              lVar15 = 0;
              do {
                JVar8 = *(JSAtom *)&(pJVar19->header).field_0x4;
                if (((JVar8 != 0) &&
                    (local_40 = pJVar10,
                    BVar7 = JS_AtomIsArrayIndex(ctx,(uint32_t *)&local_50.int32,JVar8),
                    pJVar10 = local_40, BVar7 != 0)) && (local_54 <= (uint)local_50.int32)) {
                  delete_property(ctx,p,*(JSAtom *)&(pJVar19->header).field_0x4);
                  pJVar19 = (JSShape *)((long)&(p->shape->header).ref_count + lVar17);
                  pJVar10 = p->shape;
                }
                lVar15 = lVar15 + 1;
                pJVar19 = (JSShape *)&(pJVar19->header).link;
                lVar17 = lVar17 + 8;
              } while (lVar15 < pJVar10->prop_count);
            }
          }
        }
        else {
          do {
            JVar8 = JS_NewAtomUInt32(ctx,uVar16 - 1);
            iVar5 = delete_property(ctx,p,JVar8);
            JS_FreeAtom(ctx,JVar8);
            local_5c = uVar16;
            if (iVar5 == 0) break;
            local_5c = uVar16 - 1;
            uVar16 = local_5c;
          } while (local_58 < local_5c);
        }
      }
      else {
        local_5c = local_34;
      }
      uVar1 = local_5c;
      JVar20._4_4_ = 0;
      JVar20.int32 = local_5c;
      JVar13.float64 = (double)JVar20.float64;
      if (-1 < (int)local_5c) {
        JVar13 = JVar20;
      }
      iVar11 = 7;
      if (-1 < (int)local_5c) {
        iVar11 = 0;
      }
      JVar21.tag = iVar11;
      JVar21.u.float64 = JVar13.float64;
      set_value(ctx,(JSValue *)p->prop,JVar21);
      iVar6 = 1;
      if (local_58 < uVar1) {
        iVar5 = JS_ThrowTypeErrorOrFalse(ctx,flags,"not configurable");
        return iVar5;
      }
    }
    else {
      uVar1 = (p->u).array.count;
      dVar18 = (double)(ulong)local_34;
      if (local_34 < uVar1) {
        uVar14 = (long)(int)local_34 << 4 | 8;
        dVar9 = dVar18;
        do {
          ppJVar2 = (p->u).func.var_refs;
          local_50 = (JSValueUnion)((JSValueUnion *)((long)ppJVar2 + (uVar14 - 8)))->ptr;
          iVar11 = *(int64_t *)((long)ppJVar2 + uVar14);
          if ((0xfffffff4 < (uint)iVar11) &&
             (iVar5 = *local_50.ptr, *(int *)local_50.ptr = iVar5 + -1, iVar5 < 2)) {
            v.tag = iVar11;
            v.u.ptr = local_50.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
          uVar14 = uVar14 + 0x10;
          uVar16 = SUB84(dVar9,0) + 1;
          dVar9 = (double)(ulong)uVar16;
        } while (uVar16 < uVar1);
        (p->u).array.count = local_34;
      }
      dVar9 = (double)(long)dVar18;
      if (-1 < (int)local_34) {
        dVar9 = dVar18;
      }
      iVar11 = 7;
      if (-1 < (int)local_34) {
        iVar11 = 0;
      }
      pJVar3 = p->prop;
      *(double *)&pJVar3->u = dVar9;
      (pJVar3->u).value.tag = iVar11;
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

static int set_array_length(JSContext *ctx, JSObject *p, JSValue val,
                            int flags)
{
    uint32_t len, idx, cur_len;
    int i, ret;

    /* Note: this call can reallocate the properties of 'p' */
    ret = JS_ToArrayLengthFree(ctx, &len, val, FALSE);
    if (ret)
        return -1;
    /* JS_ToArrayLengthFree() must be done before the read-only test */
    if (unlikely(!(p->shape->prop[0].flags & JS_PROP_WRITABLE)))
        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);

    if (likely(p->fast_array)) {
        uint32_t old_len = p->u.array.count;
        if (len < old_len) {
            for(i = len; i < old_len; i++) {
                JS_FreeValue(ctx, p->u.array.u.values[i]);
            }
            p->u.array.count = len;
        }
        p->prop[0].u.value = JS_NewUint32(ctx, len);
    } else {
        /* Note: length is always a uint32 because the object is an
           array */
        JS_ToUint32(ctx, &cur_len, p->prop[0].u.value);
        if (len < cur_len) {
            uint32_t d;
            JSShape *sh;
            JSShapeProperty *pr;

            d = cur_len - len;
            sh = p->shape;
            if (d <= sh->prop_count) {
                JSAtom atom;

                /* faster to iterate */
                while (cur_len > len) {
                    atom = JS_NewAtomUInt32(ctx, cur_len - 1);
                    ret = delete_property(ctx, p, atom);
                    JS_FreeAtom(ctx, atom);
                    if (unlikely(!ret)) {
                        /* unlikely case: property is not
                           configurable */
                        break;
                    }
                    cur_len--;
                }
            } else {
                /* faster to iterate thru all the properties. Need two
                   passes in case one of the property is not
                   configurable */
                cur_len = len;
                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len &&
                            !(pr->flags & JS_PROP_CONFIGURABLE)) {
                            cur_len = idx + 1;
                        }
                    }
                }

                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len) {
                            /* remove the property */
                            delete_property(ctx, p, pr->atom);
                            /* WARNING: the shape may have been modified */
                            sh = p->shape;
                            pr = get_shape_prop(sh) + i;
                        }
                    }
                }
            }
        } else {
            cur_len = len;
        }
        set_value(ctx, &p->prop[0].u.value, JS_NewUint32(ctx, cur_len));
        if (unlikely(cur_len > len)) {
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "not configurable");
        }
    }
    return TRUE;
}